

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

undefined8 __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::object_storage::
get_allocator(object_storage *this)

{
  assertion_error *this_00;
  long in_RSI;
  undefined8 in_RDI;
  string *in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  if (*(long *)(in_RSI + 8) == 0) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    assertion_error::assertion_error(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  allocator_holder<std::allocator<char>_>::get_allocator
            ((allocator_holder<std::allocator<char>_> *)in_stack_ffffffffffffff88);
  return in_RDI;
}

Assistant:

Allocator get_allocator() const
            {
                JSONCONS_ASSERT(ptr_ != nullptr);
                return ptr_->get_allocator();
            }